

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertLine
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,LineGeometry *line,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  bool bVar1;
  string *__rhs;
  size_type sVar2;
  ulong uVar3;
  aiVector3D *paVar4;
  const_reference pvVar5;
  ulong *puVar6;
  uint *puVar7;
  uint local_2f8;
  uint local_2f4;
  aiFace *local_2d0;
  aiVector3t<float> *local_298;
  value_type_conflict2 local_248;
  uint local_244;
  aiFace *paStack_240;
  int segid;
  aiFace *f;
  aiFace *paStack_230;
  uint i_1;
  aiFace *fac;
  uint scount;
  uint pcount;
  uint i;
  uint epcount;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_210;
  aiMesh *local_208;
  aiMesh *out_mesh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  format local_1d8;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,_std::allocator<int>_> *indices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_48;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices;
  aiNode *local_38;
  aiNode *nd_local;
  aiMatrix4x4 *node_global_transform_local;
  Model *model_local;
  LineGeometry *line_local;
  FBXConverter *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *temp;
  
  vertices._7_1_ = 0;
  local_38 = nd;
  nd_local = (aiNode *)node_global_transform;
  node_global_transform_local = (aiMatrix4x4 *)model;
  model_local = (Model *)line;
  line_local = (LineGeometry *)this;
  this_local = (FBXConverter *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  local_48 = LineGeometry::GetVertices((LineGeometry *)model_local);
  local_60 = LineGeometry::GetIndices((LineGeometry *)model_local);
  bVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty(local_48);
  if ((bVar1) || (bVar1 = std::vector<int,_std::allocator<int>_>::empty(local_60), bVar1)) {
    __rhs = FBX::Object::Name_abi_cxx11_(&model_local->super_Object);
    std::operator+(&local_1f8,"ignoring empty line: ",__rhs);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1d8,
               &local_1f8);
    LogFunctions<Assimp::FBXImporter>::LogWarn(&local_1d8);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  else {
    local_208 = SetupEmptyMesh(this,(Geometry *)model_local,local_38);
    local_208->mPrimitiveTypes = local_208->mPrimitiveTypes | 2;
    sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(local_48);
    local_208->mNumVertices = (uint)sVar2;
    uVar3 = (ulong)local_208->mNumVertices;
    paVar4 = (aiVector3D *)operator_new__(uVar3 * 0xc);
    if (uVar3 != 0) {
      local_298 = paVar4;
      do {
        aiVector3t<float>::aiVector3t(local_298);
        local_298 = local_298 + 1;
      } while (local_298 != paVar4 + uVar3);
    }
    local_208->mVertices = paVar4;
    local_210._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(local_48);
    _i = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(local_48);
    std::
    copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
              (local_210,
               (__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                )_i,local_208->mVertices);
    pcount = 0;
    for (scount = 0; uVar3 = (ulong)scount,
        sVar2 = std::vector<int,_std::allocator<int>_>::size(local_60), uVar3 < sVar2;
        scount = scount + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(ulong)scount);
      if (*pvVar5 < 0) {
        pcount = pcount + 1;
      }
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_60);
    fac._4_4_ = (uint)sVar2;
    fac._0_4_ = fac._4_4_ - pcount;
    local_208->mNumFaces = (uint)fac;
    uVar3 = (ulong)(uint)fac;
    puVar6 = (ulong *)operator_new__(uVar3 << 4 | 8);
    *puVar6 = uVar3;
    paStack_230 = (aiFace *)(puVar6 + 1);
    if (uVar3 != 0) {
      local_2d0 = paStack_230;
      do {
        aiFace::aiFace(local_2d0);
        local_2d0 = local_2d0 + 1;
      } while (local_2d0 != paStack_230 + uVar3);
    }
    local_208->mFaces = paStack_230;
    for (f._4_4_ = 0; f._4_4_ < fac._4_4_; f._4_4_ = f._4_4_ + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(ulong)f._4_4_);
      if (-1 < *pvVar5) {
        paStack_240 = paStack_230;
        paStack_230->mNumIndices = 2;
        paStack_230 = paStack_230 + 1;
        puVar7 = (uint *)operator_new__(8);
        paStack_240->mIndices = puVar7;
        puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_60,(ulong)f._4_4_)
        ;
        *paStack_240->mIndices = *puVar7;
        if (f._4_4_ + 1 == fac._4_4_) {
          local_2f4 = 0;
        }
        else {
          local_2f4 = f._4_4_ + 1;
        }
        puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (local_60,(ulong)local_2f4);
        local_244 = *puVar7;
        local_2f8 = local_244;
        if ((int)local_244 < 0) {
          local_2f8 = -(local_244 + 1);
        }
        paStack_240->mIndices[1] = local_2f8;
      }
    }
    sVar2 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->meshes);
    local_248 = (int)sVar2 - 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_248);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertLine(const LineGeometry& line, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            std::vector<unsigned int> temp;

            const std::vector<aiVector3D>& vertices = line.GetVertices();
            const std::vector<int>& indices = line.GetIndices();
            if (vertices.empty() || indices.empty()) {
                FBXImporter::LogWarn("ignoring empty line: " + line.Name());
                return temp;
            }

            aiMesh* const out_mesh = SetupEmptyMesh(line, nd);
            out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[out_mesh->mNumVertices];
            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            //Number of line segments (faces) is "Number of Points - Number of Endpoints"
            //N.B.: Endpoints in FbxLine are denoted by negative indices.
            //If such an Index is encountered, add 1 and multiply by -1 to get the real index.
            unsigned int epcount = 0;
            for (unsigned i = 0; i < indices.size(); i++)
            {
                if (indices[i] < 0) {
                    epcount++;
                }
            }
            unsigned int pcount = static_cast<unsigned int>( indices.size() );
            unsigned int scount = out_mesh->mNumFaces = pcount - epcount;

            aiFace* fac = out_mesh->mFaces = new aiFace[scount]();
            for (unsigned int i = 0; i < pcount; ++i) {
                if (indices[i] < 0) continue;
                aiFace& f = *fac++;
                f.mNumIndices = 2; //2 == aiPrimitiveType_LINE 
                f.mIndices = new unsigned int[2];
                f.mIndices[0] = indices[i];
                int segid = indices[(i + 1 == pcount ? 0 : i + 1)];   //If we have reached he last point, wrap around
                f.mIndices[1] = (segid < 0 ? (segid + 1)*-1 : segid); //Convert EndPoint Index to normal Index
            }
            temp.push_back(static_cast<unsigned int>(meshes.size() - 1));
            return temp;
        }